

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O3

void add_table(ecs_world_t *world,ecs_query_t *query,ecs_table_t *table)

{
  bool bVar1;
  ecs_table_t *peVar2;
  ecs_vector_t **ppeVar3;
  _Bool _Var4;
  int32_t iVar5;
  int iVar6;
  uint uVar7;
  int32_t iVar8;
  uint uVar9;
  undefined4 extraout_var;
  void *pvVar10;
  ecs_query_t *peVar11;
  ecs_query_t *component;
  uint *puVar12;
  ecs_query_t *peVar13;
  int *piVar14;
  undefined8 *puVar15;
  long *plVar16;
  ecs_vector_t *vector;
  void *pvVar17;
  ecs_type_t peVar18;
  char *pcVar19;
  char *pcVar20;
  ecs_ref_t *peVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  ecs_type_t type;
  ecs_matched_table_t *peVar25;
  uint uVar26;
  int iVar27;
  ecs_query_t *vector_00;
  ulong uVar28;
  byte bVar29;
  ecs_query_t *local_110;
  ulong local_108;
  ecs_table_t *local_100;
  int local_f4;
  ulong local_f0;
  void *local_e8;
  void *local_e0;
  ecs_type_t local_d8;
  ulong local_d0;
  undefined8 local_c8;
  int local_c0;
  uint local_bc;
  ecs_vector_t **local_b8;
  ecs_vector_t **local_b0;
  ulong local_a8;
  ecs_matched_table_t local_a0;
  ecs_table_event_t local_50;
  
  bVar29 = 0;
  iVar5 = ecs_vector_count((query->sig).columns);
  local_108 = CONCAT44(extraout_var,iVar5);
  if (table == (ecs_table_t *)0x0) {
    type = (ecs_type_t)0x0;
  }
  else {
    type = table->type;
  }
  local_bc = count_traits(query,type);
  local_c0 = (int)local_108;
  if (local_bc == 0) {
    local_f4 = local_c0 * 8;
    local_e8 = (void *)0x0;
  }
  else {
    local_f4 = local_c0 * 8;
    local_e8 = (*ecs_os_api.calloc_)(local_f4);
  }
  local_c0 = local_c0 * 4;
  local_b8 = &query->empty_tables;
  local_b0 = &query->tables;
  if ((int)local_bc < 2) {
    local_bc = 1;
  }
  local_a8 = local_108 & 0xffffffff;
  local_f0 = 0;
  local_e0 = (void *)0x0;
  local_d0 = 0;
  local_100 = table;
  do {
    local_a0.monitor = (int32_t *)0x0;
    local_a0.rank = 0;
    local_a0._76_4_ = 0;
    local_a0.sparse_columns = (ecs_vector_t *)0x0;
    local_a0.bitset_columns = (ecs_vector_t *)0x0;
    local_a0.iter_data.types = (ecs_type_t *)0x0;
    local_a0.iter_data.references = (ecs_ref_t *)0x0;
    local_a0.iter_data.data = (ecs_data_t *)0x0;
    local_a0.iter_data.components = (ecs_entity_t *)0x0;
    local_a0.iter_data.columns = (int32_t *)0x0;
    if (table != (ecs_table_t *)0x0) {
      type = table->type;
    }
    local_a0.iter_data.table = table;
    group_table(world,query,&local_a0);
    if ((int)local_108 == 0) {
      _ecs_vector_first((query->sig).columns,0x28,0x10);
LAB_0011be2c:
      vector_00 = (ecs_query_t *)0x0;
    }
    else {
      local_a0.iter_data.columns = (int32_t *)(*ecs_os_api.malloc_)(local_c0);
      _ecs_assert((ecs_query_t *)local_a0.iter_data.columns != (ecs_query_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.columns != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2ad);
      iVar6 = local_f4;
      if ((ecs_query_t *)local_a0.iter_data.columns == (ecs_query_t *)0x0) {
        __assert_fail("table_data.iter_data.columns != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2ad,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      local_a0.iter_data.components = (ecs_entity_t *)(*ecs_os_api.malloc_)(local_f4);
      _ecs_assert(local_a0.iter_data.components != (ecs_entity_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.components != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2b2);
      if (local_a0.iter_data.components == (ecs_entity_t *)0x0) {
        __assert_fail("table_data.iter_data.components != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2b2,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      local_a0.iter_data.types = (ecs_type_t *)(*ecs_os_api.malloc_)(iVar6);
      _ecs_assert(local_a0.iter_data.types != (ecs_type_t *)0x0,0x11,(char *)0x0,
                  "table_data.iter_data.types != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x2b6);
      if (local_a0.iter_data.types == (ecs_type_t *)0x0) {
        __assert_fail("table_data.iter_data.types != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x2b6,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      pvVar10 = _ecs_vector_first((query->sig).columns,0x28,0x10);
      if ((int)local_108 < 1) goto LAB_0011be2c;
      iVar6 = (int)local_d0 + 1;
      uVar28 = 0;
      vector_00 = (ecs_query_t *)0x0;
      do {
        uVar9 = *(uint *)((long)pvVar10 + uVar28 * 0x28 + 4);
        uVar26 = 5;
        if (uVar9 != 2) {
          uVar26 = *(uint *)((long)pvVar10 + uVar28 * 0x28);
        }
        *(undefined4 *)((long)&((ecs_sig_t *)local_a0.iter_data.columns)->name + uVar28 * 4) = 0;
        local_110 = (ecs_query_t *)0x0;
        if (uVar9 == 2) {
          local_110 = *(ecs_query_t **)((long)pvVar10 + uVar28 * 0x28 + 0x18);
        }
        peVar13 = local_110;
        if (uVar26 < 3) {
LAB_0011b5ac:
          if (uVar9 < 5) {
            peVar11 = (ecs_query_t *)
                      ((long)&switchD_0011b5c5::switchdataD_0013efd4 +
                      (long)(int)(&switchD_0011b5c5::switchdataD_0013efd4)[uVar9]);
            switch(uVar9) {
            default:
              component = *(ecs_query_t **)((long)pvVar10 + uVar28 * 0x28 + 0x10);
              break;
            case 1:
              peVar11 = (ecs_query_t *)
                        ecs_type_contains(world,type,
                                          *(ecs_type_t *)((long)pvVar10 + uVar28 * 0x28 + 0x10),
                                          false,true);
              component = peVar11;
              break;
            case 4:
              peVar11 = (ecs_query_t *)0xffffffffffffff;
              component = (ecs_query_t *)
                          (*(ulong *)((long)pvVar10 + uVar28 * 0x28 + 0x10) & 0xffffffffffffff);
            }
          }
          else {
            peVar11 = (ecs_query_t *)local_a0.iter_data.columns;
            component = (ecs_query_t *)0x0;
          }
          if (uVar26 == 6) {
            peVar13 = *(ecs_query_t **)((long)pvVar10 + uVar28 * 0x28 + 0x18);
          }
LAB_0011b67f:
          pvVar17 = local_e8;
          peVar2 = local_100;
          local_c8 = CONCAT71((int7)((ulong)peVar11 >> 8),uVar26 != 5);
          if ((uVar26 != 5) && (peVar13 == (ecs_query_t *)0x0)) {
            if (component == (ecs_query_t *)0x0) {
              component = (ecs_query_t *)0x0;
              peVar13 = (ecs_query_t *)0x0;
              iVar27 = 0;
            }
            else {
              if (((ulong)component & 0xff00000000000000) == 0xfa00000000000000) {
                peVar13 = (ecs_query_t *)((ulong)component & 0xffffffffffffff);
                if ((ulong)peVar13 >> 0x20 != 0) {
                  if ((int)component == 0x11b) {
                    _ecs_assert(local_e8 != (void *)0x0,0xc,(char *)0x0,"trait_offsets != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                ,0x19f);
                    if (pvVar17 == (void *)0x0) {
                      __assert_fail("trait_offsets != ((void*)0)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                    ,0x19f,
                                    "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                                   );
                    }
                    iVar27 = *(int *)((long)pvVar17 + uVar28 * 8);
                    if (*(int *)((long)pvVar17 + uVar28 * 8 + 4) == iVar6) {
                      iVar5 = iVar27 + -1;
                    }
                    else {
                      iVar5 = ecs_type_trait_index_of(type,iVar27,(ulong)peVar13 >> 0x20);
                      *(int32_t *)((long)pvVar17 + uVar28 * 8) = iVar5 + 1;
                      *(int *)((long)pvVar17 + uVar28 * 8 + 4) = iVar6;
                    }
                    _ecs_assert(iVar5 != -1,0xc,(char *)0x0,"result != -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                ,0x1ae);
                    if (iVar5 == -1) {
                      __assert_fail("result != -1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                    ,0x1ae,
                                    "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                                   );
                    }
                    puVar12 = (uint *)_ecs_vector_get(type,8,0x10,iVar5);
                    _ecs_assert(puVar12 != (uint *)0x0,0xc,(char *)0x0,"trait != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                ,0x1b3);
                    if (puVar12 == (uint *)0x0) {
                      __assert_fail("trait != ((void*)0)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                    ,0x1b3,
                                    "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                                   );
                    }
                    component = (ecs_query_t *)(ulong)*puVar12;
                  }
                  goto LAB_0011b9b0;
                }
                _ecs_assert(local_e8 != (void *)0x0,0xc,(char *)0x0,"trait_offsets != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0x17f);
                if (pvVar17 == (void *)0x0) {
                  __assert_fail("trait_offsets != ((void*)0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                ,0x17f,
                                "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                               );
                }
                iVar27 = *(int *)((long)pvVar17 + uVar28 * 8);
                if (*(int *)((long)pvVar17 + uVar28 * 8 + 4) == iVar6) {
                  iVar5 = iVar27 + -1;
                }
                else {
                  iVar5 = ecs_type_trait_index_of(type,iVar27,(ecs_entity_t)peVar13);
                  *(int32_t *)((long)pvVar17 + uVar28 * 8) = iVar5 + 1;
                  *(int *)((long)pvVar17 + uVar28 * 8 + 4) = iVar6;
                }
                if (iVar5 == -1) {
                  iVar27 = -1;
                }
                else {
                  local_d8 = (ecs_type_t)_ecs_vector_get(type,8,0x10,iVar5);
                  component = *(ecs_query_t **)local_d8;
                  pvVar17 = ecs_get_w_entity(world,(ecs_entity_t)peVar13,1);
                  if (pvVar17 == (void *)0x0) {
                    peVar13 = (ecs_query_t *)(ulong)(uint)local_d8->count;
                  }
                  iVar27 = iVar5 + 1;
                }
              }
              else {
                if (((ulong)component & 0xff00000000000000) == 0xfc00000000000000) {
                  iVar5 = ecs_table_switch_from_case(world,local_100,(ecs_entity_t)component);
                  _ecs_assert(iVar5 != -1,0xc,(char *)0x0,"result != -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                              ,0x175);
                  if (iVar5 == -1) {
                    __assert_fail("result != -1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                  ,0x175,
                                  "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                                 );
                  }
                  iVar5 = iVar5 + peVar2->sw_column_offset;
                  peVar13 = component;
                }
                else {
LAB_0011b9b0:
                  iVar5 = ecs_type_index_of(type,(ecs_entity_t)component);
                  peVar13 = component;
                }
                component = peVar13;
                iVar27 = iVar5 + 1;
                if (iVar5 + 1 == 0) {
                  iVar27 = -1;
                }
              }
              if ((((ulong)peVar13 & 0xff00000000000000) != 0xfb00000000000000) &&
                 (((ulong)peVar13 & 0xff00000000000000) != 0xfc00000000000000)) {
                peVar13 = (ecs_query_t *)ecs_get_typeid(world,(ecs_entity_t)peVar13);
                piVar14 = (int *)ecs_get_w_entity(world,(ecs_entity_t)peVar13,1);
                if ((piVar14 == (int *)0x0) || (*piVar14 == 0)) {
                  iVar27 = 0;
                }
              }
            }
            iVar24 = 0;
            if ((uVar9 == 4) ||
               (((uVar9 == 3 &&
                 (_Var4 = ecs_type_has_entity(world,type,(ecs_entity_t)peVar13), !_Var4)) ||
                (iVar24 = iVar27, iVar27 != -1)))) {
              if (uVar9 == 3 && uVar26 == 2) {
                iVar24 = 0;
              }
            }
            else {
              iVar24 = -(uint)(uVar9 != 3 || uVar26 != 1);
            }
            *(int *)((long)&((ecs_sig_t *)local_a0.iter_data.columns)->name + uVar28 * 4) = iVar24;
            if (((ulong)component & 0xff00000000000000) == 0xfc00000000000000) {
              puVar15 = (undefined8 *)_ecs_vector_add(&local_a0.sparse_columns,0x18,0x10);
              *(int *)(puVar15 + 2) = (int)uVar28;
              puVar15[1] = (ulong)component & 0xffffffffffffff;
              *puVar15 = 0;
            }
            if ((iVar24 == 0) || ((local_100->flags & 0x20000) == 0)) goto LAB_0011bafe;
            iVar5 = ecs_type_index_of(local_100->type,
                                      (ulong)component & 0xffffffffffffff | 0xf400000000000000);
            if (iVar5 != -1) {
              puVar15 = (undefined8 *)_ecs_vector_add(&local_a0.bitset_columns,0x10,0x10);
              *(int32_t *)(puVar15 + 1) = iVar5;
              *puVar15 = 0;
              local_c8 = CONCAT71((int7)((ulong)puVar15 >> 8),1);
            }
            peVar13 = (ecs_query_t *)0x0;
          }
          else if (peVar13 != (ecs_query_t *)0x0) goto LAB_0011b742;
LAB_0011bb61:
          bVar1 = true;
          if ((uVar26 == 7) ||
             (*(int *)((long)&((ecs_sig_t *)local_a0.iter_data.columns)->name + uVar28 * 4) == -1))
          goto LAB_0011bb87;
        }
        else {
          if (uVar26 != 5) {
            if (uVar26 == 6) goto LAB_0011b5ac;
            if ((uVar26 & 0xfffffffb) == 3) {
              if (uVar9 != 3) {
                if (uVar9 == 1) {
                  component = (ecs_query_t *)
                              components_contains(world,type,
                                                  *(ecs_type_t *)
                                                   ((long)pvVar10 + uVar28 * 0x28 + 0x10),
                                                  (ecs_entity_t *)&local_110,false);
                  peVar11 = component;
                  peVar13 = local_110;
                  goto LAB_0011b67f;
                }
                if (uVar9 != 0) goto LAB_0011b7ec;
              }
              component = *(ecs_query_t **)((long)pvVar10 + uVar28 * 0x28 + 0x10);
              peVar11 = (ecs_query_t *)
                        ecs_find_in_type(world,type,(ecs_entity_t)component,0xfd00000000000000);
              peVar13 = peVar11;
            }
            else if (uVar26 == 4) {
              if (uVar9 == 0) {
                component = *(ecs_query_t **)((long)pvVar10 + uVar28 * 0x28 + 0x10);
              }
              else {
                component = (ecs_query_t *)0x0;
              }
              peVar13 = (ecs_query_t *)query->system;
              peVar11 = query;
            }
            else {
LAB_0011b7ec:
              component = (ecs_query_t *)0x0;
              peVar11 = (ecs_query_t *)(ulong)(uVar26 & 0xfffffffb);
            }
            goto LAB_0011b67f;
          }
          component = *(ecs_query_t **)((long)pvVar10 + uVar28 * 0x28 + 0x10);
          local_c8 = 0;
          if (local_110 == (ecs_query_t *)0x0) {
LAB_0011bafe:
            peVar13 = (ecs_query_t *)0x0;
            goto LAB_0011bb61;
          }
LAB_0011b742:
          bVar1 = false;
LAB_0011bb87:
          local_110 = vector_00;
          piVar14 = (int *)ecs_get_w_entity(world,(ecs_entity_t)component,1);
          peVar21 = (ecs_ref_t *)_ecs_vector_add((ecs_vector_t **)&local_110,0x30,0x10);
          if (uVar26 - 5 < 2) {
LAB_0011bcc7:
            _ecs_assert(peVar13 != (ecs_query_t *)0x0,0xc,(char *)0x0,"e != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                        ,0x209);
            if (peVar13 == (ecs_query_t *)0x0) {
              __assert_fail("e != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0x209,
                            "ecs_vector_t *add_ref(ecs_world_t *, ecs_query_t *, ecs_type_t, ecs_vector_t *, ecs_entity_t, ecs_entity_t, ecs_sig_from_kind_t)"
                           );
            }
          }
          else {
            if ((uVar26 != 4) && (uVar26 != 7)) {
              vector = type;
              if (!bVar1) {
                plVar16 = (long *)_ecs_sparse_get_sparse
                                            ((world->store).entity_index,0x10,(uint64_t)peVar13);
                _ecs_assert(plVar16 != (long *)0x0,0xc,(char *)0x0,"record != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0x38);
                if (plVar16 == (long *)0x0) {
                  __assert_fail("record != ((void*)0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                                ,0x38,
                                "ecs_entity_t get_entity_for_component(ecs_world_t *, ecs_entity_t, ecs_type_t, ecs_entity_t)"
                               );
                }
                if ((undefined8 *)*plVar16 == (undefined8 *)0x0) {
                  vector = (ecs_vector_t *)0x0;
                }
                else {
                  vector = *(ecs_vector_t **)*plVar16;
                }
              }
              uVar7 = ecs_vector_count(vector);
              local_d8 = vector;
              pvVar17 = _ecs_vector_first(vector,8,0x10);
              if (0 < (int)uVar7) {
                uVar23 = 0;
                do {
                  if (*(ecs_query_t **)((long)pvVar17 + uVar23 * 8) == component) goto LAB_0011bcc1;
                  uVar23 = uVar23 + 1;
                } while (uVar7 != uVar23);
              }
              peVar13 = (ecs_query_t *)
                        ecs_find_entity_in_prefabs
                                  (world,(ecs_entity_t)peVar13,local_d8,(ecs_entity_t)component,0);
            }
LAB_0011bcc1:
            if (uVar26 != 7) goto LAB_0011bcc7;
          }
          peVar21->record = (ecs_record_t *)0x0;
          peVar21->ptr = (void *)0x0;
          peVar21->table = (void *)0x0;
          peVar21->row = 0;
          peVar21->alloc_count = 0;
          peVar21->entity = (ecs_entity_t)peVar13;
          peVar21->component = (ecs_entity_t)component;
          _Var4 = ecs_has_type(world,(ecs_entity_t)component,FLECS__TEcsComponent);
          if ((_Var4) && ((char)local_c8 == '\x01' && *piVar14 != 0)) {
            if (peVar13 != (ecs_query_t *)0x0) {
              ecs_get_ref_w_entity(world,peVar21,(ecs_entity_t)peVar13,(ecs_entity_t)component);
              ecs_set_watch(world,(ecs_entity_t)peVar13);
            }
            *(byte *)&query->flags = (byte)query->flags | 0x40;
          }
          vector_00 = local_110;
          iVar5 = ecs_vector_count((ecs_vector_t *)local_110);
          *(int32_t *)((long)&((ecs_sig_t *)local_a0.iter_data.columns)->name + uVar28 * 4) = -iVar5
          ;
        }
        local_a0.iter_data.components[uVar28] = (ecs_entity_t)component;
        if (uVar9 == 4) {
          pvVar17 = ecs_get_w_entity(world,(ecs_entity_t)component,3);
          _ecs_assert(pvVar17 != (void *)0x0,2,(char *)0x0,"type != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x277);
          if (pvVar17 == (void *)0x0) {
            __assert_fail("type != ((void*)0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x277,
                          "ecs_type_t get_column_type(ecs_world_t *, ecs_sig_oper_kind_t, ecs_entity_t)"
                         );
          }
          peVar18 = *(ecs_type_t *)((long)pvVar17 + 8);
        }
        else {
          peVar18 = ecs_type_from_entity(world,(ecs_entity_t)component);
        }
        local_a0.iter_data.types[uVar28] = peVar18;
        uVar28 = uVar28 + 1;
      } while (uVar28 != local_a8);
    }
    ppeVar3 = local_b0;
    table = local_100;
    if ((local_100 == (ecs_table_t *)0x0) || ((query->flags & 0xe) != 0)) {
      puVar15 = (undefined8 *)_ecs_vector_add(local_b0,0x50,0x10);
      iVar5 = ecs_vector_count(*ppeVar3);
      _ecs_assert(0 < iVar5,0xc,(char *)0x0,"matched_table_index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x335);
      if (iVar5 < 1) {
        __assert_fail("matched_table_index >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x335,"void add_table(ecs_world_t *, ecs_query_t *, ecs_table_t *)");
      }
      iVar5 = iVar5 + -1;
    }
    else {
      puVar15 = (undefined8 *)_ecs_vector_add(local_b8,0x50,0x10);
      iVar5 = ecs_vector_count(query->empty_tables);
      iVar6 = (int)local_f0;
      local_e0 = (*ecs_os_api.realloc_)(local_e0,iVar6 * 4 + 4);
      *(int32_t *)((long)local_e0 + (long)iVar6 * 4) = -iVar5;
      pcVar19 = ecs_type_str(world,table->type);
      if (query->system == 0) {
        pcVar20 = (query->sig).expr;
      }
      else {
        pcVar20 = ecs_get_name(world,query->system);
      }
      local_f0 = (ulong)((int)local_f0 + 1);
      _ecs_trace(2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                 ,0x327,"query #[green]%s#[reset] matched with table #[green][%s]",pcVar20,pcVar19);
      (*ecs_os_api.free_)(pcVar19);
      table = local_100;
    }
    if (vector_00 != (ecs_query_t *)0x0) {
      iVar8 = ecs_vector_count((ecs_vector_t *)vector_00);
      peVar21 = (ecs_ref_t *)(*ecs_os_api.malloc_)(iVar8 * 0x30);
      local_a0.iter_data.references = peVar21;
      pvVar10 = _ecs_vector_first((ecs_vector_t *)vector_00,0x30,0x10);
      table = local_100;
      memcpy(peVar21,pvVar10,(long)(iVar8 * 0x30));
      ecs_vector_free((ecs_vector_t *)vector_00);
    }
    pvVar10 = local_e0;
    peVar25 = &local_a0;
    for (lVar22 = 10; lVar22 != 0; lVar22 = lVar22 + -1) {
      *puVar15 = (peVar25->iter_data).columns;
      peVar25 = (ecs_matched_table_t *)((long)peVar25 + ((ulong)bVar29 * -2 + 1) * 8);
      puVar15 = puVar15 + (ulong)bVar29 * -2 + 1;
    }
    uVar9 = (int)local_d0 + 1;
    local_d0 = (ulong)uVar9;
  } while (uVar9 != local_bc);
  if (local_e0 == (void *)0x0) {
    if (table == (ecs_table_t *)0x0) goto LAB_0011c0a1;
  }
  else {
    puVar15 = (undefined8 *)_ecs_map_ensure(query->table_indices,0x10,(ulong)table->id);
    if ((void *)*puVar15 != (void *)0x0) {
      (*ecs_os_api.free_)((void *)*puVar15);
    }
    *puVar15 = pvVar10;
    *(int *)(puVar15 + 1) = (int)local_f0;
  }
  if ((query->flags & 0x100) == 0) {
    local_50.kind = EcsTableQueryMatch;
    local_50.component = 0;
    local_50.query = query;
    local_50.matched_table_index = iVar5;
    ecs_table_notify(world,table,&local_50);
  }
  else {
    iVar5 = ecs_table_count(table);
    if (iVar5 != 0) {
      activate_table(world,query,table,true);
    }
  }
LAB_0011c0a1:
  if (local_e8 != (void *)0x0) {
    (*ecs_os_api.free_)(local_e8);
  }
  return;
}

Assistant:

static
void add_table(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_table_t *table)
{
    ecs_type_t table_type = NULL;
    int32_t c, column_count = ecs_vector_count(query->sig.columns);

    if (table) {
        table_type = table->type;
    }

    int32_t trait_cur = 0, trait_count = count_traits(query, table_type);
    
    /* If the query has traits, we need to account for the fact that a table may
     * have multiple components to which the trait is applied, which means the
     * table has to be registered with the query multiple times, with different
     * table columns. If so, allocate a small array for each trait in which the
     * last added table index of the trait is stored, so that in the next 
     * iteration we can start the search from the correct offset type. */
    trait_offset_t *trait_offsets = NULL;
    if (trait_count) {
        trait_offsets = ecs_os_calloc(
            ECS_SIZEOF(trait_offset_t) * column_count);
    }

    /* From here we recurse */
    int32_t *table_indices = NULL;
    int32_t table_indices_count = 0;
    int32_t matched_table_index = 0;
    ecs_matched_table_t table_data;
    ecs_vector_t *references = NULL;

add_trait:
    table_data = (ecs_matched_table_t){ .iter_data.table = table };
    if (table) {
        table_type = table->type;
    }

    /* If grouping is enabled for query, assign the group rank to the table */
    group_table(world, query, &table_data);

    if (column_count) {
        /* Array that contains the system column to table column mapping */
        table_data.iter_data.columns = ecs_os_malloc(ECS_SIZEOF(int32_t) * column_count);
        ecs_assert(table_data.iter_data.columns != NULL, ECS_OUT_OF_MEMORY, NULL);

        /* Store the components of the matched table. In the case of OR expressions,
        * components may differ per matched table. */
        table_data.iter_data.components = ecs_os_malloc(ECS_SIZEOF(ecs_entity_t) * column_count);
        ecs_assert(table_data.iter_data.components != NULL, ECS_OUT_OF_MEMORY, NULL);

        /* Also cache types, so no lookup is needed while iterating */
        table_data.iter_data.types = ecs_os_malloc(ECS_SIZEOF(ecs_type_t) * column_count);
        ecs_assert(table_data.iter_data.types != NULL, ECS_OUT_OF_MEMORY, NULL);        
    }

    /* Walk columns parsed from the system signature */
    ecs_sig_column_t *columns = ecs_vector_first(
        query->sig.columns, ecs_sig_column_t);

    for (c = 0; c < column_count; c ++) {
        ecs_sig_column_t *column = &columns[c];
        ecs_entity_t entity = 0, component = 0;
        ecs_sig_oper_kind_t op = column->oper_kind;
        ecs_sig_from_kind_t from = column->from_kind;

        if (op == EcsOperNot) {
            from = EcsFromEmpty;
        }

        table_data.iter_data.columns[c] = 0;

        /* Get actual component and component source for current column */
        get_comp_and_src(world, query, table_type, column, op, from, &component, 
            &entity);

        /* This column does not retrieve data from a static entity (either
         * EcsFromSystem or EcsFromParent) and is not just a handle */
        if (!entity && from != EcsFromEmpty) {
            int32_t index = get_component_index(world, table, table_type, 
                &component, c, op, trait_offsets, trait_cur + 1);

            if (index == -1) {
                if (from == EcsFromOwned && op == EcsOperOptional) {
                    index = 0;
                }
            } else {
                if (from == EcsFromShared && op == EcsOperOptional) {
                    index = 0;
                }
            }

            table_data.iter_data.columns[c] = index;

            /* If the column is a case, we should only iterate the entities in
             * the column for this specific case. Add a sparse column with the
             * case id so we can find the correct entities when iterating */
            if (ECS_HAS_ROLE(component, CASE)) {
                ecs_sparse_column_t *sc = ecs_vector_add(
                    &table_data.sparse_columns, ecs_sparse_column_t);
                sc->signature_column_index = c;
                sc->sw_case = component & ECS_COMPONENT_MASK;
                sc->sw_column = NULL;
            }

            /* If table has a disabled bitmask for components, check if there is
             * a disabled column for the queried for component. If so, cache it
             * in a vector as the iterator will need to skip the entity when the
             * component is disabled. */
            if (index && (table->flags & EcsTableHasDisabled)) {
                ecs_entity_t bs_id = 
                    (component & ECS_COMPONENT_MASK) | ECS_DISABLED;
                int32_t bs_index = ecs_type_index_of(table->type, bs_id);
                if (bs_index != -1) {
                    ecs_bitset_column_t *elem = ecs_vector_add(
                        &table_data.bitset_columns, ecs_bitset_column_t);
                    elem->column_index = bs_index;
                    elem->bs_column = NULL;
                }
            }
        }

        /* Check if a the component is a reference. If 'entity' is set, the
         * component must be resolved from another entity, which is the case
         * for FromEntity and FromContainer. 
         * 
         * If no entity is set but the component is not found in the table, it
         * must come from a prefab. This is guaranteed, as at this point it is
         * already validated that the table matches with the system.
         * 
         * If the column from is Cascade, there may not be an entity in case the
         * current table contains root entities. In that case, still add a
         * reference field. The application can, after the table has matched,
         * change the set of components, so that this column will turn into a
         * reference. Having the reference already linked to the system table
         * makes changing this administation easier when the change happens.
         */
        if ((entity || table_data.iter_data.columns[c] == -1 || from == EcsCascade)) {
            references = add_ref(world, query, table_type, references, 
                component, entity, from);
            table_data.iter_data.columns[c] = -ecs_vector_count(references);
        }

        table_data.iter_data.components[c] = component;
        table_data.iter_data.types[c] = get_column_type(world, op, component);
    }

    /* Initially always add table to inactive group. If the system is registered
     * with the table and the table is not empty, the table will send an
     * activate signal to the system. */

    ecs_matched_table_t *table_elem;
    if (table && has_auto_activation(query)) {
        table_elem = ecs_vector_add(&query->empty_tables, 
            ecs_matched_table_t);

        /* Store table index */
        matched_table_index = ecs_vector_count(query->empty_tables);
        table_indices_count ++;
        table_indices = ecs_os_realloc(
            table_indices, table_indices_count * ECS_SIZEOF(int32_t));
        table_indices[table_indices_count - 1] = -matched_table_index;

        #ifndef NDEBUG
        char *type_expr = ecs_type_str(world, table->type);
        ecs_trace_2("query #[green]%s#[reset] matched with table #[green][%s]",
            query_name(world, query), type_expr);
        ecs_os_free(type_expr);
        #endif
    } else {
        /* If no table is provided to function, this is a system that contains
         * no columns that require table matching. In this case, the system will
         * only have one "dummy" table that caches data from the system columns.
         * Always add this dummy table to the list of active tables, since it
         * would never get activated otherwise. */
        table_elem = ecs_vector_add(&query->tables, ecs_matched_table_t);

        /* If query doesn't automatically activates/inactivates tables, we can 
         * get the count to determine the current table index. */
        matched_table_index = ecs_vector_count(query->tables) - 1;
        ecs_assert(matched_table_index >= 0, ECS_INTERNAL_ERROR, NULL);
    }

    if (references) {
        ecs_size_t ref_size = ECS_SIZEOF(ecs_ref_t) * ecs_vector_count(references);
        table_data.iter_data.references = ecs_os_malloc(ref_size);
        ecs_os_memcpy(table_data.iter_data.references, 
            ecs_vector_first(references, ecs_ref_t), ref_size);
        ecs_vector_free(references);
        references = NULL;
    }

    *table_elem = table_data;

    /* Use tail recursion when adding table for multiple traits */
    trait_cur ++;
    if (trait_cur < trait_count) {
        goto add_trait;
    }

    /* Register table indices before sending out the match signal. This signal
     * can cause table activation, and table indices are needed for that. */
    if (table_indices) {
        ecs_table_indices_t *ti = ecs_map_ensure(
            query->table_indices, ecs_table_indices_t, table->id);
        if (ti->indices) {
            ecs_os_free(ti->indices);
        }
        ti->indices = table_indices;
        ti->count = table_indices_count;
    }

    if (table && !(query->flags & EcsQueryIsSubquery)) {
        ecs_table_notify(world, table, &(ecs_table_event_t){
            .kind = EcsTableQueryMatch,
            .query = query,
            .matched_table_index = matched_table_index
        });
    } else if (table && ecs_table_count(table)) {
        activate_table(world, query, table, true);
    }

    if (trait_offsets) {
        ecs_os_free(trait_offsets);
    }
}